

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unix-sockets.c
# Opt level: O1

int lws_plat_set_socket_options_ip(lws_sockfd_type fd,uint8_t pri,int lws_flags)

{
  int iVar1;
  uint *puVar2;
  undefined7 in_register_00000031;
  char **ppcVar3;
  ulong uVar4;
  long lVar5;
  int optval;
  undefined8 local_38;
  
  local_38._4_4_ = (uint)CONCAT71(in_register_00000031,pri);
  if (local_38._4_4_ == 0) {
    local_38 = 0;
  }
  else {
    uVar4 = CONCAT71(in_register_00000031,pri) & 0xffffffff;
    iVar1 = setsockopt(fd,1,0xc,(void *)((long)&local_38 + 4),4);
    if (iVar1 < 0) {
      local_38 = CONCAT44(local_38._4_4_,1);
      puVar2 = (uint *)__errno_location();
      _lws_log(2,"%s: unable to set socket pri %d: errno %d\n","lws_plat_set_socket_options_ip",
               uVar4,(ulong)*puVar2);
    }
    else {
      local_38 = (ulong)local_38._4_4_ << 0x20;
      _lws_log(4,"%s: set pri %u\n","lws_plat_set_socket_options_ip",uVar4);
    }
  }
  ppcVar3 = ip_opt_names;
  lVar5 = 0;
  do {
    if ((*(uint *)((long)ip_opt_lws_flags + lVar5) & lws_flags) != 0) {
      local_38 = CONCAT44(*(undefined4 *)((long)ip_opt_val + lVar5),(int)local_38);
      iVar1 = setsockopt(fd,0,1,(void *)((long)&local_38 + 4),4);
      if (iVar1 < 0) {
        puVar2 = (uint *)__errno_location();
        _lws_log(2,"%s: unable to set %s: errno %d\n","lws_plat_set_socket_options_ip",*ppcVar3,
                 (ulong)*puVar2);
        local_38 = 1;
      }
      else {
        _lws_log(4,"%s: set ip flag %s\n","lws_plat_set_socket_options_ip",*ppcVar3);
      }
    }
    ppcVar3 = ppcVar3 + 1;
    lVar5 = lVar5 + 4;
  } while (lVar5 != 0x10);
  return (int)local_38;
}

Assistant:

int
lws_plat_set_socket_options_ip(lws_sockfd_type fd, uint8_t pri, int lws_flags)
{
	int optval = (int)pri, ret = 0, n;
	socklen_t optlen = sizeof(optval);
#if !defined(LWS_WITH_NO_LOGS)
	int en;
#endif

#if 0
#if defined(TCP_FASTOPEN_CONNECT)
	optval = 1;
	if (setsockopt(fd, IPPROTO_TCP, TCP_FASTOPEN_CONNECT, (void *)&optval,
		       sizeof(optval)))
		lwsl_warn("%s: FASTOPEN_CONNECT failed\n", __func__);
	optval = (int)pri;
#endif
#endif

#if !defined(__APPLE__) && \
      !defined(__FreeBSD__) && !defined(__FreeBSD_kernel__) &&        \
      !defined(__NetBSD__) && \
      !defined(__OpenBSD__) && \
      !defined(__sun) && \
      !defined(__HAIKU__) && \
      !defined(__CYGWIN__)

	/* the BSDs don't have SO_PRIORITY */

	if (pri) { /* 0 is the default already */
		if (setsockopt(fd, SOL_SOCKET, SO_PRIORITY,
				(const void *)&optval, optlen) < 0) {
#if !defined(LWS_WITH_NO_LOGS)
			en = errno;
			lwsl_warn("%s: unable to set socket pri %d: errno %d\n",
				  __func__, (int)pri, en);
#endif
			ret = 1;
		} else
			lwsl_notice("%s: set pri %u\n", __func__, pri);
	}
#endif

	for (n = 0; n < 4; n++) {
		if (!(lws_flags & ip_opt_lws_flags[n]))
			continue;

		optval = (int)ip_opt_val[n];
		if (setsockopt(fd, IPPROTO_IP, IP_TOS, (const void *)&optval,
			       optlen) < 0) {
#if !defined(LWS_WITH_NO_LOGS)
			en = errno;
			lwsl_warn("%s: unable to set %s: errno %d\n", __func__,
				  ip_opt_names[n], en);
#endif
			ret = 1;
		} else
			lwsl_notice("%s: set ip flag %s\n", __func__,
				    ip_opt_names[n]);
	}

	return ret;
}